

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

double __thiscall llvm::detail::frexp(detail *this,double __x,int *__exponent)

{
  Storage *RHS;
  fltCategory fVar1;
  double __x_00;
  double extraout_XMM0_Qa;
  APFloat First;
  APFloat Second;
  undefined1 auStack_a8 [40];
  Storage local_80 [24];
  undefined1 local_68 [8];
  Storage local_60;
  APFloat local_48;
  
  if (*(undefined1 **)__exponent == semPPCDoubleDouble) {
    llvm::frexp((llvm *)auStack_a8,__x,*(int **)(__exponent + 2));
    RHS = &local_48.U;
    APFloat::Storage::Storage((Storage *)&RHS->IEEE,(Storage *)(*(long *)(__exponent + 2) + 0x28));
    fVar1 = DoubleAPFloat::getCategory((DoubleAPFloat *)__exponent);
    if (fVar1 == fcNormal) {
      APFloat::Storage::Storage(local_80,RHS);
      llvm::scalbn(__x_00,(int)local_68);
      APFloat::Storage::operator=((Storage *)&RHS->IEEE,&local_60);
      APFloat::Storage::~Storage((Storage *)&local_60.IEEE);
      APFloat::Storage::~Storage(local_80);
    }
    DoubleAPFloat::DoubleAPFloat
              ((DoubleAPFloat *)this,(fltSemantics *)semPPCDoubleDouble,(APFloat *)auStack_a8,
               &local_48);
    APFloat::Storage::~Storage((Storage *)&RHS->IEEE);
    APFloat::Storage::~Storage((Storage *)(auStack_a8 + 8));
    return extraout_XMM0_Qa;
  }
  __assert_fail("Arg.Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1135,
                "DoubleAPFloat llvm::detail::frexp(const DoubleAPFloat &, int &, APFloat::roundingMode)"
               );
}

Assistant:

DoubleAPFloat frexp(const DoubleAPFloat &Arg, int &Exp,
                    APFloat::roundingMode RM) {
  assert(Arg.Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat First = frexp(Arg.Floats[0], Exp, RM);
  APFloat Second = Arg.Floats[1];
  if (Arg.getCategory() == APFloat::fcNormal)
    Second = scalbn(Second, -Exp, RM);
  return DoubleAPFloat(semPPCDoubleDouble, std::move(First), std::move(Second));
}